

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O3

void __thiscall
Inferences::AdditionGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
          *poly)

{
  Variable key;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *this_00;
  int var_00;
  long lVar2;
  Cell *pCVar3;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  uint uVar5;
  Variable v;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *o;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar6;
  uint uVar7;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar8;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar9;
  ulong uVar10;
  bool dummy;
  Option<Kernel::Variable> var;
  MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> gen;
  Set<Kernel::Variable,_Lib::StlHash> didOccur;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> monom;
  bool local_121;
  Preprocess *local_120;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_118;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_e8;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_e0;
  Set<Kernel::Variable,_Lib::StlHash> local_c0;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_98;
  __mpz_struct local_88;
  __mpz_struct local_78;
  uint local_68;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_60;
  RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
  local_54 [36];
  
  local_c0._capacity = 0;
  local_c0._nonemptyCells = 0;
  local_c0._size = 0;
  local_c0._entries = (Cell *)0x0;
  local_120 = this;
  Lib::Set<Kernel::Variable,_Lib::StlHash>::expand(&local_c0);
  local_118.numeral._den._val[0]._mp_d = (mp_limb_t *)poly->_ptr;
  o = (((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
       local_118.numeral._den._val[0]._mp_d)->_summands)._stack;
  lVar2 = (long)(((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 local_118.numeral._den._val[0]._mp_d)->_summands)._cursor - (long)o;
  local_118.numeral._num._val[0]._mp_d = (mp_limb_t *)poly;
  if (o != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0 && lVar2 != 0) {
    local_118.numeral._den._val[0]._0_8_ = (lVar2 >> 4) * -0x5555555555555555;
    uVar10 = 1;
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_88,(IntegerConstantType *)o);
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_78,&(o->numeral)._den);
      local_68 = (o->factors)._id;
      local_60 = (o->factors)._ptr;
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar(&local_118);
      var_00 = local_118.numeral._num._val[0]._mp_size;
      local_118.factors._0_8_ = uVar10;
      if ((char)local_118.numeral._num._val[0]._mp_alloc == '\x01') {
        uVar5 = 2;
        if (2 < (uint)local_118.numeral._num._val[0]._mp_size) {
          uVar5 = local_118.numeral._num._val[0]._mp_size;
        }
        uVar10 = (ulong)uVar5 % (local_c0._0_8_ & 0xffffffff);
        uVar7 = local_c0._entries[uVar10].code;
        if (uVar7 != 0) {
          pCVar3 = local_c0._entries + uVar10;
          do {
            if ((uVar7 == uVar5) &&
               ((pCVar3->value)._num == local_118.numeral._num._val[0]._mp_size)) goto LAB_0048f4c1;
            pCVar3 = pCVar3 + 1;
            if (pCVar3 == local_c0._afterLast) {
              pCVar3 = local_c0._entries;
            }
            uVar7 = pCVar3->code;
          } while (uVar7 != 0);
        }
        local_e0._capacity._0_4_ = local_118.numeral._num._val[0]._mp_size;
        Lib::Set<Kernel::Variable,Lib::StlHash>::
        rawFindOrInsert<Lib::Set<Kernel::Variable,Lib::StlHash>::insert(Kernel::Variable,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Variable,Lib::StlHash>::insert(Kernel::Variable,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<Kernel::Variable,Lib::StlHash> *)&local_c0,
                   (anon_class_8_1_ba1d8281)&local_e0,local_118.numeral._num._val[0]._mp_size,
                   (anon_class_8_1_ba1d8281)&local_e0,&local_121);
        local_98._id = *(uint *)local_118.numeral._num._val[0]._mp_d;
        local_98._ptr =
             *(Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
              ((long)local_118.numeral._num._val[0]._mp_d + 8);
        MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomSet
                  ((MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0,
                   (Variable)var_00,&local_98);
        Lib::
        Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
        ::operator()((Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
                      *)local_120->map,(Variable)var_00,
                     (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0,
                     (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                  (&local_e0);
      }
      else {
LAB_0048f4c1:
        pMVar4 = (local_60->_factors)._stack;
        pMVar1 = (local_60->_factors)._cursor;
        lVar2 = (long)pMVar1 - (long)pMVar4;
        if (pMVar4 != (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0 &&
            lVar2 != 0) {
          pMVar9 = (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   ((lVar2 >> 2) * 0x6db6db6db6db6db7);
          uVar10 = (ulong)(pMVar1 != pMVar4);
          pMVar6 = (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)(uVar10 - 1);
          local_e8 = local_60;
          pMVar8 = local_60;
          local_118.factors._ptr = pMVar9;
          do {
            if ((undefined1  [24])
                ((undefined1  [24])
                 (pMVar4->term).super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                & (undefined1  [24])0x3) == (undefined1  [24])0x1) {
              key._num = *(uint *)(pMVar4->term).super_PolyNfSuper._inner.
                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                  .
                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                  ._content;
              this_00 = local_120->map;
              MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::bot();
              AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::AnyNumber
                        ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)local_54,
                         (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0);
              Lib::
              Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
              ::replaceOrInsert(this_00,key,
                                (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)
                                local_54);
              Lib::CoproductImpl::
              RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
                        (local_54,(anon_class_8_1_8991fb9c)local_54);
              Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                        (&local_e0);
              pMVar8 = local_e8;
              pMVar9 = local_118.factors._ptr;
            }
            pMVar6 = (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     ((long)&(pMVar6->_factors)._capacity + 1);
            if (pMVar9 <= pMVar6) break;
            pMVar1 = (pMVar8->_factors)._stack;
            pMVar4 = pMVar1 + uVar10;
            uVar10 = uVar10 + 1;
          } while (pMVar1 != (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0);
        }
      }
      mpz_clear(&local_78);
      mpz_clear(&local_88);
      if ((ulong)local_118.numeral._den._val[0]._0_8_ <= (ulong)local_118.factors._0_8_) break;
      uVar10 = local_118.factors._0_8_ + 1;
      o = ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
          local_118.numeral._den._val[0]._mp_d)->_stack + local_118.factors._0_8_;
    } while( true );
  }
  if (local_c0._entries != (Cell *)0x0) {
    uVar10 = (long)local_c0._capacity * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      (local_c0._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (local_c0._entries)->value = (Variable)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c0._entries;
    }
    else if (uVar10 < 0x11) {
      (local_c0._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (local_c0._entries)->value = (Variable)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c0._entries;
    }
    else if (uVar10 < 0x19) {
      (local_c0._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (local_c0._entries)->value = (Variable)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c0._entries;
    }
    else if (uVar10 < 0x21) {
      (local_c0._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (local_c0._entries)->value = (Variable)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c0._entries;
    }
    else if (uVar10 < 0x31) {
      (local_c0._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (local_c0._entries)->value = (Variable)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c0._entries;
    }
    else if (uVar10 < 0x41) {
      (local_c0._entries)->code = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (local_c0._entries)->value = (Variable)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c0._entries;
    }
    else {
      operator_delete(local_c0._entries,0x10);
    }
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> poly)
  {
    // a variable might occur twice within one sum.
    Set<Variable, StlHash> didOccur;
    for (auto monom : poly->iterSummands()) {
      auto var = monom.tryVar();

      if (var.isSome() && !didOccur.contains(var.unwrap())) {
        auto v = var.unwrap();
        didOccur.insert(v);
        auto gen = MonomSet<NumTraits>(v, poly);
        map.updateOrInit(v,
            [&](AnyNumber<MonomSet> old_) 
            { 
              auto old = old_.downcast<NumTraits>().unwrap();
              auto result = std::move(old).intersect(std::move(gen));
              return AnyNumber<MonomSet>(std::move(result));
            },
            [&]() { return AnyNumber<MonomSet>(std::move(gen)); });
      } else {
        for (auto factor : monom.factors->iter()) {
           if (factor.term.template is<Variable>()) {
             auto v = factor.term.template unwrap<Variable>();
             map.replaceOrInsert(v, MonomSet<NumTraits>::bot());
           }
        }
      }

    }
  }